

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O3

void __thiscall
mp::pre::
RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
::PresolveBasisEntry
          (RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
           *this,LinkEntry *be)

{
  ValueNode *pVVar1;
  int v;
  
  v = ((this->
       super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
       ).ndl_._M_elems[0]->vi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[be->_M_elems[0]];
  if (v == 3) {
    v = 4;
  }
  else if (v == 4) {
    v = 3;
  }
  pVVar1 = (this->
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           ).ndl_._M_elems[2];
  ValueNode::SetNum<std::vector<int,std::allocator<int>>>
            (pVVar1,&pVVar1->vi_,(long)be->_M_elems[2],v);
  pVVar1 = (this->
           super_BasicStaticIndivEntryLink<mp::pre::RangeCon2Slack<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>,_3,_3,_1>
           ).ndl_._M_elems[1];
  ValueNode::SetNum<std::vector<int,std::allocator<int>>>
            (pVVar1,&pVVar1->vi_,(long)be->_M_elems[1],5);
  return;
}

Assistant:

void PresolveBasisEntry(const typename Base::LinkEntry& be) {
    SetInt(be, VAR_SLK, ReverseBasisLowUpp( GetInt(be, CON_SRC)) );
    SetInt(be, CON_TARGET, (int)BasicStatus::equ);
  }